

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CompressorScheme CVar4;
  ChannelData *pCVar5;
  exr_coding_channel_info_t *peVar6;
  uint8_t *puVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  uint8_t *puVar12;
  long lVar13;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  lVar8 = 0;
  do {
    alStack_48[lVar8] = (long)me->_planarUncBuffer[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  iVar1 = me->_numChannels;
  if ((long)iVar1 != 0) {
    lVar8 = 0x218;
    lVar9 = 0;
    do {
      pCVar5 = me->_channelData;
      peVar6 = pCVar5[lVar9].chan;
      iVar2 = peVar6->width;
      iVar3 = peVar6->height;
      lVar13 = (long)peVar6->bytes_per_element;
      sVar11 = (long)iVar3 * (long)iVar2 * lVar13;
      pCVar5[lVar9].planarUncSize = sVar11;
      CVar4 = pCVar5[lVar9].compression;
      puVar7 = (uint8_t *)alStack_48[CVar4];
      pCVar5[lVar9].planarUncBuffer = puVar7;
      pCVar5[lVar9].planarUncBufferEnd = puVar7;
      pCVar5[lVar9].planarUncRle[0] = puVar7;
      pCVar5[lVar9].planarUncRleEnd[0] = puVar7;
      if (1 < lVar13) {
        lVar10 = 0;
        puVar12 = puVar7;
        do {
          puVar12 = puVar12 + iVar3 * iVar2;
          *(uint8_t **)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar8 + -0x40) = puVar12;
          *(uint8_t **)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar8 + -0x20) = puVar12;
          lVar10 = lVar10 + 1;
        } while (lVar13 + -1 != lVar10);
      }
      pCVar5[lVar9].planarUncType = (uint)peVar6->data_type;
      if (CVar4 == LOSSY_DCT) {
        pCVar5[lVar9].planarUncType = EXR_PIXEL_FLOAT;
      }
      else {
        alStack_48[CVar4] = (long)(puVar7 + sVar11);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x240;
    } while (lVar9 != iVar1);
  }
  return iVar1;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < curc->bytes_per_element; ++byte)
        {
            cd->planarUncRle[byte] =
                cd->planarUncRle[byte - 1] + curc->width * curc->height;

            cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}